

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O1

void __thiscall
Test_Template_GetTemplate::Test_Template_GetTemplate(Test_Template_GetTemplate *this)

{
  _func_void *local_8;
  
  local_8 = Run;
  if (g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<void(*)(),std::allocator<void(*)()>>::_M_realloc_insert<void(*)()>
              ((vector<void(*)(),std::allocator<void(*)()>> *)&g_testlist,
               (iterator)
               g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_8);
  }
  else {
    *g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
     super__Vector_impl_data._M_finish = Run;
    g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
    super__Vector_impl_data._M_finish =
         g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  return;
}

Assistant:

TEST(Template, GetTemplate) {
  // Tests the cache
  string filename = StringToTemplateFile("{This is perfectly valid} yay!");
  Template* tpl1 = Template::GetTemplate(filename, DO_NOT_STRIP);
  Template* tpl2 = Template::GetTemplate(filename.c_str(), DO_NOT_STRIP);
  Template* tpl3 = Template::GetTemplate(filename, STRIP_WHITESPACE);
  ASSERT(tpl1 && tpl2 && tpl3);
  ASSERT(tpl1 == tpl2);
  ASSERT(tpl1 != tpl3);

  // Tests that a nonexistent template returns NULL
  Template* tpl4 = Template::GetTemplate("/yakakak", STRIP_WHITESPACE);
  ASSERT(!tpl4);

  // Tests that syntax errors cause us to return NULL
  Template* tpl5 = StringToTemplate("{{This has spaces in it}}", DO_NOT_STRIP);
  ASSERT(!tpl5);
  Template* tpl6 = StringToTemplate("{{#SEC}}foo", DO_NOT_STRIP);
  ASSERT(!tpl6);
  Template* tpl7 = StringToTemplate("{{#S1}}foo{{/S2}}", DO_NOT_STRIP);
  ASSERT(!tpl7);
  Template* tpl8 = StringToTemplate("{{#S1}}foo{{#S2}}bar{{/S1}{{/S2}",
                                    DO_NOT_STRIP);
  ASSERT(!tpl8);
  Template* tpl9 = StringToTemplate("{{noend", DO_NOT_STRIP);
  ASSERT(!tpl9);
}